

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

XMLCh * __thiscall
PSVIWriterHandlers::translateValidity(PSVIWriterHandlers *this,VALIDITY_STATE validity)

{
  VALIDITY_STATE validity_local;
  PSVIWriterHandlers *this_local;
  
  if (validity == VALIDITY_NOTKNOWN) {
    this_local = (PSVIWriterHandlers *)&xercesc_4_0::PSVIUni::fgNotKnown;
  }
  else if (validity == VALIDITY_INVALID) {
    this_local = (PSVIWriterHandlers *)&xercesc_4_0::PSVIUni::fgInvalid;
  }
  else if (validity == VALIDITY_VALID) {
    this_local = (PSVIWriterHandlers *)&xercesc_4_0::PSVIUni::fgValid;
  }
  else {
    this_local = (PSVIWriterHandlers *)&xercesc_4_0::PSVIUni::fgUnknown;
  }
  return (XMLCh *)this_local;
}

Assistant:

const XMLCh* PSVIWriterHandlers::translateValidity(PSVIItem::VALIDITY_STATE validity) {
	switch (validity) {
		case PSVIItem::VALIDITY_NOTKNOWN :
			return PSVIUni::fgNotKnown;
		case PSVIItem::VALIDITY_VALID :
			return PSVIUni::fgValid;
		case PSVIItem::VALIDITY_INVALID :
			return PSVIUni::fgInvalid;
		default :
			return PSVIUni::fgUnknown;
	}
}